

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O3

bool __thiscall
HighsMipSolverData::checkSolution
          (HighsMipSolverData *this,vector<double,_std::allocator<double>_> *solution)

{
  double *pdVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  HighsLp *pHVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer piVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  pHVar5 = this->mipsolver->model_;
  uVar2 = pHVar5->num_col_;
  pdVar6 = (solution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)uVar2 == 0) {
    dVar14 = this->feastol;
  }
  else {
    pdVar7 = (pHVar5->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar14 = this->feastol;
    uVar10 = 0;
    do {
      dVar13 = pdVar6[uVar10];
      if (((dVar13 < pdVar7[uVar10] - dVar14) ||
          ((pHVar5->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar10] + dVar14 < dVar13)) ||
         (((pHVar5->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar10] == kInteger &&
          (dVar12 = round(dVar13), dVar14 < ABS(dVar13 - dVar12))))) {
        return false;
      }
      uVar10 = uVar10 + 1;
    } while (uVar2 != uVar10);
  }
  piVar8 = (this->ARstart_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = 0;
  while( true ) {
    bVar11 = uVar10 == (uint)pHVar5->num_row_;
    if (bVar11) {
      return true;
    }
    iVar3 = piVar8[uVar10];
    iVar4 = piVar8[uVar10 + 1];
    dVar13 = 0.0;
    if (iVar4 != iVar3) {
      lVar9 = 0;
      do {
        dVar13 = dVar13 + pdVar6[(this->ARindex_).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[iVar3 + lVar9]] *
                          (this->ARvalue_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[iVar3 + lVar9];
        lVar9 = lVar9 + 1;
      } while (iVar4 - iVar3 != (int)lVar9);
    }
    if ((pHVar5->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar10] + dVar14 < dVar13) break;
    pdVar1 = (pHVar5->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + uVar10;
    uVar10 = uVar10 + 1;
    if (dVar13 < *pdVar1 - dVar14) {
      return bVar11;
    }
  }
  return bVar11;
}

Assistant:

bool HighsMipSolverData::checkSolution(
    const std::vector<double>& solution) const {
  for (HighsInt i = 0; i != mipsolver.model_->num_col_; ++i) {
    if (solution[i] < mipsolver.model_->col_lower_[i] - feastol) return false;
    if (solution[i] > mipsolver.model_->col_upper_[i] + feastol) return false;
    if (mipsolver.variableType(i) == HighsVarType::kInteger &&
        fractionality(solution[i]) > feastol)
      return false;
  }

  for (HighsInt i = 0; i != mipsolver.model_->num_row_; ++i) {
    double rowactivity = 0.0;

    HighsInt start = ARstart_[i];
    HighsInt end = ARstart_[i + 1];

    for (HighsInt j = start; j != end; ++j)
      rowactivity += solution[ARindex_[j]] * ARvalue_[j];

    if (rowactivity > mipsolver.rowUpper(i) + feastol) return false;
    if (rowactivity < mipsolver.rowLower(i) - feastol) return false;
  }

  return true;
}